

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vending_machine.hpp
# Opt level: O2

void __thiscall vending::vending_def::add_goods(vending_def *this,load_goods *entry)

{
  iterator iVar1;
  load_done local_21;
  goods_entry local_20;
  
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_vending::goods_entry>,_std::_Select1st<std::pair<const_unsigned_long,_vending::goods_entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_vending::goods_entry>_>_>
          ::find(&(this->goods)._M_t,&entry->p_no);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->goods)._M_t._M_impl.super__Rb_tree_header) {
    local_20.amount = entry->amount;
    local_20.price = 0.0;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,vending::goods_entry>,std::_Select1st<std::pair<unsigned_long_const,vending::goods_entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,vending::goods_entry>>>
    ::_M_emplace_unique<unsigned_long&,vending::goods_entry>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,vending::goods_entry>,std::_Select1st<std::pair<unsigned_long_const,vending::goods_entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,vending::goods_entry>>>
                *)&this->goods,&entry->p_no,&local_20);
  }
  else {
    *(int *)&iVar1._M_node[1]._M_parent = *(int *)&iVar1._M_node[1]._M_parent + entry->amount;
  }
  afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  ::process_event<vending::events::load_done>
            ((state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
              *)this,&local_21);
  return;
}

Assistant:

void
    add_goods(events::load_goods&& entry)
    {
        auto f = goods.find(entry.p_no);
        if (f == goods.end()) {
            goods.emplace(entry.p_no, goods_entry{entry.amount, 0});
        } else {
            f->second.amount += entry.amount;
        }
        rebind().process_event(events::load_done{});
    }